

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall llvm::SmallVectorImpl<int>::pop_back_val(SmallVectorImpl<int> *this)

{
  int iVar1;
  reference piVar2;
  
  piVar2 = SmallVectorTemplateCommon<int,_void>::back((SmallVectorTemplateCommon<int,_void> *)this);
  iVar1 = *piVar2;
  SmallVectorTemplateBase<int,_true>::pop_back(&this->super_SmallVectorTemplateBase<int,_true>);
  return iVar1;
}

Assistant:

LLVM_NODISCARD T pop_back_val() {
    T Result = ::std::move(this->back());
    this->pop_back();
    return Result;
  }